

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::ProducerIPCClientImpl::NotifyDataSourceStopped
          (ProducerIPCClientImpl *this,DataSourceInstanceID id)

{
  function<void_(perfetto::ipc::AsyncResult<perfetto::protos::gen::NotifyDataSourceStoppedResponse>)>
  local_a0;
  Deferred<perfetto::protos::gen::NotifyDataSourceStoppedResponse> local_80;
  undefined1 local_50 [8];
  NotifyDataSourceStoppedRequest req;
  DataSourceInstanceID id_local;
  ProducerIPCClientImpl *this_local;
  
  req._has_field_.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)(_Base_bitset<1UL>)id;
  if ((this->connected_ & 1U) == 0) {
    perfetto::base::ignore_result<char[67]>
              ((char (*) [67])"Cannot NotifyDataSourceStopped(), not connected to tracing service");
  }
  else {
    protos::gen::NotifyDataSourceStoppedRequest::NotifyDataSourceStoppedRequest
              ((NotifyDataSourceStoppedRequest *)local_50);
    protos::gen::NotifyDataSourceStoppedRequest::set_data_source_id
              ((NotifyDataSourceStoppedRequest *)local_50,
               (uint64_t)req._has_field_.super__Base_bitset<1UL>._M_w);
    std::
    function<void_(perfetto::ipc::AsyncResult<perfetto::protos::gen::NotifyDataSourceStoppedResponse>)>
    ::function(&local_a0,(nullptr_t)0x0);
    ipc::Deferred<perfetto::protos::gen::NotifyDataSourceStoppedResponse>::Deferred
              (&local_80,&local_a0);
    protos::gen::ProducerPortProxy::NotifyDataSourceStopped
              (&this->producer_port_,(NotifyDataSourceStoppedRequest *)local_50,&local_80,-1);
    ipc::Deferred<perfetto::protos::gen::NotifyDataSourceStoppedResponse>::~Deferred(&local_80);
    std::
    function<void_(perfetto::ipc::AsyncResult<perfetto::protos::gen::NotifyDataSourceStoppedResponse>)>
    ::~function(&local_a0);
    protos::gen::NotifyDataSourceStoppedRequest::~NotifyDataSourceStoppedRequest
              ((NotifyDataSourceStoppedRequest *)local_50);
  }
  return;
}

Assistant:

void ProducerIPCClientImpl::NotifyDataSourceStopped(DataSourceInstanceID id) {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  if (!connected_) {
    PERFETTO_DLOG(
        "Cannot NotifyDataSourceStopped(), not connected to tracing service");
    return;
  }
  protos::gen::NotifyDataSourceStoppedRequest req;
  req.set_data_source_id(id);
  producer_port_.NotifyDataSourceStopped(
      req, ipc::Deferred<protos::gen::NotifyDataSourceStoppedResponse>());
}